

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

bool __thiscall
Assimp::FBX::FBXConverter::GenerateTransformationNodeChain
          (FBXConverter *this,Model *model,string *name,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *output_nodes,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *post_output_nodes)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  PropertyTable *in;
  float *pfVar4;
  ImportSettings *pIVar5;
  reference ppVar6;
  aiMatrix4x4t<float> *__src;
  aiNode *paVar7;
  size_type sVar8;
  float fVar9;
  aiVector3t<float> aVar10;
  uint local_e4c;
  aiMatrix4x4t<float> *local_be0;
  aiMatrix4x4t<float> local_bd8;
  aiMatrix4x4 *local_b98;
  aiMatrix4x4 *transform;
  aiMatrix4x4 *__end2;
  aiMatrix4x4 *__begin2;
  aiMatrix4x4 (*__range2) [17];
  aiNode *nd;
  aiNode *local_b50;
  aiNode *nd_1;
  ulong uStack_b40;
  TransformationComp comp;
  size_t i_1;
  iterator iStack_b30;
  uint bit;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_b28;
  uint local_b1c;
  iterator iStack_b18;
  uint anim_chain_bitmask;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_b10;
  const_iterator it;
  format local_ae8;
  aiVector3t<float> local_970;
  aiVector3t<float> local_95c;
  aiVector3t<float> local_950;
  allocator local_939;
  string local_938;
  aiVector3t<float> local_914;
  aiVector3t<float> *local_908;
  aiVector3D *GeometricTranslation;
  float local_8f8;
  allocator local_8e9;
  string local_8e8;
  aiVector3D *local_8c4;
  float local_8bc;
  aiVector3D *local_8b8;
  aiVector3D *GeometricRotation;
  byte local_8a5;
  uint i;
  bool canscale;
  aiVector3D GeometricScalingInverse;
  aiVector3t<float> local_884;
  aiVector3t<float> local_878;
  allocator local_861;
  string local_860;
  aiVector3t<float> local_83c;
  aiVector3t<float> *local_830;
  aiVector3D *GeometricScaling;
  float local_820;
  allocator local_811;
  string local_810;
  aiVector3D *local_7ec;
  float local_7e4;
  aiVector3D *local_7e0;
  aiVector3D *Rotation;
  float local_7d0;
  aiVector3D *local_7c4;
  float local_7bc;
  aiVector3t<float> local_7b8;
  allocator local_7a1;
  string local_7a0;
  aiVector3t<float> local_77c;
  aiVector3t<float> *local_770;
  aiVector3D *Scaling;
  float local_760;
  allocator local_751;
  string local_750;
  aiVector3D *local_72c;
  float local_724;
  aiVector3t<float> *local_720;
  aiVector3D *Translation;
  float local_710;
  aiVector3D *local_704;
  float local_6fc;
  aiVector3t<float> local_6f8;
  allocator local_6e1;
  string local_6e0;
  aiVector3t<float> local_6bc;
  aiVector3t<float> *local_6b0;
  aiVector3D *ScalingPivot;
  float local_6a0;
  allocator local_691;
  string local_690;
  aiVector3D *local_66c;
  float local_664;
  aiVector3t<float> *local_660;
  aiVector3D *ScalingOffset;
  float local_650;
  allocator local_641;
  string local_640;
  aiVector3D *local_61c;
  float local_614;
  aiVector3t<float> *local_610;
  aiVector3D *RotationOffset;
  float local_600;
  aiVector3D *local_5f4;
  float local_5ec;
  aiVector3t<float> local_5e8;
  allocator local_5d1;
  string local_5d0;
  aiVector3t<float> local_5ac;
  aiVector3t<float> *local_5a0;
  aiVector3D *RotationPivot;
  float local_590;
  allocator local_581;
  string local_580;
  aiVector3D *local_55c;
  float local_554;
  aiVector3D *local_550;
  aiVector3D *PostRotation;
  float local_540;
  allocator local_521;
  string local_520;
  aiVector3D *local_4fc;
  float local_4f4;
  aiVector3D *local_4f0;
  aiVector3D *PreRotation;
  aiVector3D all_ones;
  float zero_epsilon;
  uint32_t chainMaskComplex;
  uint32_t chainMaskSimple;
  uint32_t chainBits;
  aiMatrix4x4 chain [17];
  bool ok;
  RotOrder rot;
  PropertyTable *props;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *post_output_nodes_local;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *output_nodes_local;
  string *name_local;
  Model *model_local;
  FBXConverter *this_local;
  
  in = Model::Props(model);
  chain[0x10].d4 = (float)Model::RotationOrder(model);
  local_be0 = (aiMatrix4x4t<float> *)&chainMaskSimple;
  do {
    aiMatrix4x4t<float>::aiMatrix4x4t(local_be0);
    local_be0 = local_be0 + 1;
  } while (local_be0 != (aiMatrix4x4t<float> *)&chain[0x10].d3);
  chainMaskComplex = 0;
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&all_ones.z);
  std::fill_n<aiMatrix4x4t<float>*,unsigned_int,aiMatrix4x4t<float>>
            ((aiMatrix4x4t<float> *)&chainMaskSimple,0x11,(aiMatrix4x4t<float> *)&all_ones.z);
  all_ones.y = Math::getEpsilon<float>();
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&PreRotation + 4),1.0,1.0,1.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"PreRotation",&local_521);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_520,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_540 = aVar10.z;
  PostRotation = aVar10._0_8_;
  local_4fc = PostRotation;
  local_4f4 = local_540;
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  local_4f0 = (aiVector3D *)&local_4fc;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_4f0), all_ones.y < fVar9)) {
    chainMaskComplex = 0x40;
    GetRotationMatrix(this,RotOrder_EulerXYZ,local_4f0,(aiMatrix4x4 *)&chain[5].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"PostRotation",&local_581);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_580,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_590 = aVar10.z;
  RotationPivot = aVar10._0_8_;
  local_55c = RotationPivot;
  local_554 = local_590;
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  local_550 = (aiVector3D *)&local_55c;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_550), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x100;
    GetRotationMatrix(this,RotOrder_EulerXYZ,local_550,(aiMatrix4x4 *)&chain[7].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,"RotationPivot",&local_5d1);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_5d0,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_5e8.z = aVar10.z;
  local_5e8._0_8_ = aVar10._0_8_;
  local_5ac._0_8_ = local_5e8._0_8_;
  local_5ac.z = local_5e8.z;
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  local_5a0 = &local_5ac;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_5a0), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x220;
    aiMatrix4x4t<float>::Translation(local_5a0,(aiMatrix4x4t<float> *)&chain[4].d3);
    aVar10 = ::operator-(local_5a0);
    local_600 = aVar10.z;
    RotationOffset = aVar10._0_8_;
    local_5f4 = RotationOffset;
    local_5ec = local_600;
    aiMatrix4x4t<float>::Translation
              ((aiVector3t<float> *)&local_5f4,(aiMatrix4x4t<float> *)&chain[8].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"RotationOffset",&local_641);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_640,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_650 = aVar10.z;
  ScalingOffset = aVar10._0_8_;
  local_61c = ScalingOffset;
  local_614 = local_650;
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  local_610 = (aiVector3t<float> *)&local_61c;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_610), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x10;
    aiMatrix4x4t<float>::Translation(local_610,(aiMatrix4x4t<float> *)&chain[3].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_690,"ScalingOffset",&local_691);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_690,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_6a0 = aVar10.z;
  ScalingPivot = aVar10._0_8_;
  local_66c = ScalingPivot;
  local_664 = local_6a0;
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  local_660 = (aiVector3t<float> *)&local_66c;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_660), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x400;
    aiMatrix4x4t<float>::Translation(local_660,(aiMatrix4x4t<float> *)&chain[9].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e0,"ScalingPivot",&local_6e1);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_6e0,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_6f8.z = aVar10.z;
  local_6f8._0_8_ = aVar10._0_8_;
  local_6bc._0_8_ = local_6f8._0_8_;
  local_6bc.z = local_6f8.z;
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  local_6b0 = &local_6bc;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_6b0), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x2800;
    aiMatrix4x4t<float>::Translation(local_6b0,(aiMatrix4x4t<float> *)&chain[10].d3);
    aVar10 = ::operator-(local_6b0);
    local_710 = aVar10.z;
    Translation = aVar10._0_8_;
    local_704 = Translation;
    local_6fc = local_710;
    aiMatrix4x4t<float>::Translation
              ((aiVector3t<float> *)&local_704,(aiMatrix4x4t<float> *)&chain[0xc].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_750,"Lcl Translation",&local_751);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_750,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_760 = aVar10.z;
  Scaling = aVar10._0_8_;
  local_72c = Scaling;
  local_724 = local_760;
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  local_720 = (aiVector3t<float> *)&local_72c;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_720), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 8;
    aiMatrix4x4t<float>::Translation(local_720,(aiMatrix4x4t<float> *)&chain[2].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a0,"Lcl Scaling",&local_7a1);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_7a0,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_7b8.z = aVar10.z;
  local_7b8._0_8_ = aVar10._0_8_;
  local_77c._0_8_ = local_7b8._0_8_;
  local_77c.z = local_7b8.z;
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  local_770 = &local_77c;
  bVar3 = false;
  if ((chain[0x10].d3._3_1_ & 1) != 0) {
    aVar10 = ::operator-(local_770,(aiVector3t<float> *)((long)&PreRotation + 4));
    local_7d0 = aVar10.z;
    Rotation = aVar10._0_8_;
    local_7c4 = Rotation;
    local_7bc = local_7d0;
    fVar9 = aiVector3t<float>::SquareLength((aiVector3t<float> *)&local_7c4);
    bVar3 = all_ones.y < fVar9;
  }
  if (bVar3) {
    chainMaskComplex = chainMaskComplex | 0x1000;
    aiMatrix4x4t<float>::Scaling(local_770,(aiMatrix4x4t<float> *)&chain[0xb].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_810,"Lcl Rotation",&local_811);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_810,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_820 = aVar10.z;
  GeometricScaling = aVar10._0_8_;
  local_7ec = GeometricScaling;
  local_7e4 = local_820;
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  local_7e0 = (aiVector3D *)&local_7ec;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_7e0), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x80;
    GetRotationMatrix(this,(RotOrder)chain[0x10].d4,local_7e0,(aiMatrix4x4 *)&chain[6].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_860,"GeometricScaling",&local_861);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_860,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_878.z = aVar10.z;
  local_878._0_8_ = aVar10._0_8_;
  local_83c._0_8_ = local_878._0_8_;
  local_83c.z = local_878.z;
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  local_830 = &local_83c;
  bVar3 = false;
  if ((chain[0x10].d3._3_1_ & 1) != 0) {
    aVar10 = ::operator-(local_830,(aiVector3t<float> *)((long)&PreRotation + 4));
    local_884.z = aVar10.z;
    GeometricScalingInverse._4_8_ = aVar10._0_8_;
    local_884._0_8_ = GeometricScalingInverse._4_8_;
    fVar9 = aiVector3t<float>::SquareLength(&local_884);
    bVar3 = all_ones.y < fVar9;
  }
  uVar2 = chainMaskComplex;
  if (bVar3) {
    aiMatrix4x4t<float>::Scaling(local_830,(aiMatrix4x4t<float> *)&chain[0xf].d3);
    i = local_830->x;
    unique0x00012004 = local_830->y;
    GeometricScalingInverse.x = local_830->z;
    local_8a5 = 1;
    for (GeometricRotation._4_4_ = 0; GeometricRotation._4_4_ < 3;
        GeometricRotation._4_4_ = GeometricRotation._4_4_ + 1) {
      pfVar4 = aiVector3t<float>::operator[]((aiVector3t<float> *)&i,GeometricRotation._4_4_);
      dVar1 = std::fabs((double)(ulong)(uint)*pfVar4);
      if (SUB84(dVar1,0) <= all_ones.y) {
        LogFunctions<Assimp::FBXImporter>::LogError
                  ("cannot invert geometric scaling matrix with a 0.0 scale component");
        local_8a5 = 0;
        break;
      }
      fVar9 = aiVector3t<float>::operator[](local_830,GeometricRotation._4_4_);
      pfVar4 = aiVector3t<float>::operator[]((aiVector3t<float> *)&i,GeometricRotation._4_4_);
      *pfVar4 = 1.0 / fVar9;
    }
    uVar2 = chainMaskComplex | 0x10000;
    if ((local_8a5 & 1) != 0) {
      aiMatrix4x4t<float>::Scaling((aiVector3t<float> *)&i,(aiMatrix4x4t<float> *)&chainMaskSimple);
      uVar2 = chainMaskComplex | 0x10001;
    }
  }
  chainMaskComplex = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e8,"GeometricRotation",&local_8e9);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_8e8,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_8f8 = aVar10.z;
  GeometricTranslation = aVar10._0_8_;
  local_8c4 = GeometricTranslation;
  local_8bc = local_8f8;
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  local_8b8 = (aiVector3D *)&local_8c4;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_8b8), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x8002;
    GetRotationMatrix(this,(RotOrder)chain[0x10].d4,local_8b8,(aiMatrix4x4 *)&chain[0xe].d3);
    GetRotationMatrix(this,(RotOrder)chain[0x10].d4,local_8b8,(aiMatrix4x4 *)&chain[0].d3);
    aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&chain[0].d3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_938,"GeometricTranslation",&local_939);
  aVar10 = PropertyGet<aiVector3t<float>>(in,&local_938,(bool *)((long)&chain[0x10].d3 + 3),false);
  local_950.z = aVar10.z;
  local_950._0_8_ = aVar10._0_8_;
  local_914._0_8_ = local_950._0_8_;
  local_914.z = local_950.z;
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  local_908 = &local_914;
  if (((chain[0x10].d3._3_1_ & 1) != 0) &&
     (fVar9 = aiVector3t<float>::SquareLength(local_908), all_ones.y < fVar9)) {
    chainMaskComplex = chainMaskComplex | 0x4004;
    aiMatrix4x4t<float>::Translation(local_908,(aiMatrix4x4t<float> *)&chain[0xd].d3);
    aVar10 = ::operator-(local_908);
    local_970.z = aVar10.z;
    local_970._0_8_ = aVar10._0_8_;
    local_95c._0_8_ = local_970._0_8_;
    local_95c.z = local_970.z;
    aiMatrix4x4t<float>::Translation(&local_95c,(aiMatrix4x4t<float> *)&chain[1].d3);
  }
  bVar3 = NeedsComplexTransformationChain(this,model);
  if (bVar3 != ((chainMaskComplex & 0x1ef77) != 0)) {
    __assert_fail("NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x326,
                  "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (((chainMaskComplex & 0x1ef77) == 0) ||
     (pIVar5 = Document::Settings(this->doc), (pIVar5->preservePivots & 1U) == 0)) {
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    __range2 = (aiMatrix4x4 (*) [17])paVar7;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              (output_nodes,(value_type *)&__range2);
    aiString::Set((aiString *)__range2,name);
    transform = (aiMatrix4x4 *)&chain[0x10].d3;
    __end2 = (aiMatrix4x4 *)&chainMaskSimple;
    __begin2 = __end2;
    for (; __end2 != transform; __end2 = __end2 + 1) {
      local_b98 = __end2;
      aiMatrix4x4t<float>::operator*(&local_bd8,(aiMatrix4x4t<float> *)&(*__range2)[0x10].a2,__end2)
      ;
      memcpy(&(*__range2)[0x10].a2,&local_bd8,0x40);
    }
    this_local._7_1_ = false;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "generating full transformation chain for node: ",name);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_ae8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
    LogFunctions<Assimp::FBXImporter>::LogInfo(&local_ae8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_ae8);
    std::__cxx11::string::~string((string *)&it);
    iStack_b18 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&this->node_anim_chain_bits,name);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::_Rb_tree_const_iterator(&local_b10,&stack0xfffffffffffff4e8);
    iStack_b30 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::end(&this->node_anim_chain_bits);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::_Rb_tree_const_iterator(&local_b28,&stack0xfffffffffffff4d0);
    bVar3 = std::operator==(&local_b10,&local_b28);
    if (bVar3) {
      local_e4c = 0;
    }
    else {
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               ::operator*(&local_b10);
      local_e4c = ppVar6->second;
    }
    local_b1c = local_e4c;
    i_1._4_4_ = 1;
    for (uStack_b40 = 0; uStack_b40 < 0x11; uStack_b40 = uStack_b40 + 1) {
      nd_1._4_4_ = (TransformationComp)uStack_b40;
      if (((chainMaskComplex & i_1._4_4_) != 0) || ((local_b1c & i_1._4_4_) != 0)) {
        if (nd_1._4_4_ == TransformationComp_PostRotation) {
          __src = aiMatrix4x4t<float>::Inverse
                            ((aiMatrix4x4t<float> *)(&chainMaskSimple + uStack_b40 * 0x10));
          memcpy(&chainMaskSimple + uStack_b40 * 0x10,__src,0x40);
        }
        paVar7 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar7);
        local_b50 = paVar7;
        NameTransformationChainNode((string *)&nd,this,name,nd_1._4_4_);
        aiString::Set((aiString *)paVar7,(string *)&nd);
        std::__cxx11::string::~string((string *)&nd);
        memcpy(&local_b50->mTransformation,&chainMaskSimple + uStack_b40 * 0x10,0x40);
        if (((nd_1._4_4_ == TransformationComp_GeometricScalingInverse) ||
            (nd_1._4_4_ == TransformationComp_GeometricRotationInverse)) ||
           (nd_1._4_4_ == TransformationComp_GeometricTranslationInverse)) {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(post_output_nodes,&local_b50);
        }
        else {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(output_nodes,&local_b50);
        }
      }
      i_1._4_4_ = i_1._4_4_ << 1;
    }
    sVar8 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(output_nodes);
    if (sVar8 == 0) {
      __assert_fail("output_nodes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0x350,
                    "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                   );
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FBXConverter::GenerateTransformationNodeChain(const Model& model, const std::string& name, std::vector<aiNode*>& output_nodes,
            std::vector<aiNode*>& post_output_nodes) {
            const PropertyTable& props = model.Props();
            const Model::RotOrder rot = model.RotationOrder();

            bool ok;

            aiMatrix4x4 chain[TransformationComp_MAXIMUM];

            ai_assert(TransformationComp_MAXIMUM < 32);
            std::uint32_t chainBits = 0;
            // A node won't need a node chain if it only has these.
            const std::uint32_t chainMaskSimple = (1 << TransformationComp_Translation) + (1 << TransformationComp_Scaling) + (1 << TransformationComp_Rotation);
            // A node will need a node chain if it has any of these.
            const std::uint32_t chainMaskComplex = ((1 << (TransformationComp_MAXIMUM)) - 1) - chainMaskSimple;

            std::fill_n(chain, static_cast<unsigned int>(TransformationComp_MAXIMUM), aiMatrix4x4());

            // generate transformation matrices for all the different transformation components
            const float zero_epsilon = Math::getEpsilon<float>();
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);

            const aiVector3D& PreRotation = PropertyGet<aiVector3D>(props, "PreRotation", ok);
            if (ok && PreRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PreRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PreRotation, chain[TransformationComp_PreRotation]);
            }

            const aiVector3D& PostRotation = PropertyGet<aiVector3D>(props, "PostRotation", ok);
            if (ok && PostRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PostRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PostRotation, chain[TransformationComp_PostRotation]);
            }

            const aiVector3D& RotationPivot = PropertyGet<aiVector3D>(props, "RotationPivot", ok);
            if (ok && RotationPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationPivot) | (1 << TransformationComp_RotationPivotInverse);

                aiMatrix4x4::Translation(RotationPivot, chain[TransformationComp_RotationPivot]);
                aiMatrix4x4::Translation(-RotationPivot, chain[TransformationComp_RotationPivotInverse]);
            }

            const aiVector3D& RotationOffset = PropertyGet<aiVector3D>(props, "RotationOffset", ok);
            if (ok && RotationOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationOffset);

                aiMatrix4x4::Translation(RotationOffset, chain[TransformationComp_RotationOffset]);
            }

            const aiVector3D& ScalingOffset = PropertyGet<aiVector3D>(props, "ScalingOffset", ok);
            if (ok && ScalingOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingOffset);

                aiMatrix4x4::Translation(ScalingOffset, chain[TransformationComp_ScalingOffset]);
            }

            const aiVector3D& ScalingPivot = PropertyGet<aiVector3D>(props, "ScalingPivot", ok);
            if (ok && ScalingPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingPivot) | (1 << TransformationComp_ScalingPivotInverse);

                aiMatrix4x4::Translation(ScalingPivot, chain[TransformationComp_ScalingPivot]);
                aiMatrix4x4::Translation(-ScalingPivot, chain[TransformationComp_ScalingPivotInverse]);
            }

            const aiVector3D& Translation = PropertyGet<aiVector3D>(props, "Lcl Translation", ok);
            if (ok && Translation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Translation);

                aiMatrix4x4::Translation(Translation, chain[TransformationComp_Translation]);
            }

            const aiVector3D& Scaling = PropertyGet<aiVector3D>(props, "Lcl Scaling", ok);
            if (ok && (Scaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Scaling);

                aiMatrix4x4::Scaling(Scaling, chain[TransformationComp_Scaling]);
            }

            const aiVector3D& Rotation = PropertyGet<aiVector3D>(props, "Lcl Rotation", ok);
            if (ok && Rotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Rotation);

                GetRotationMatrix(rot, Rotation, chain[TransformationComp_Rotation]);
            }

            const aiVector3D& GeometricScaling = PropertyGet<aiVector3D>(props, "GeometricScaling", ok);
            if (ok && (GeometricScaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricScaling);
                aiMatrix4x4::Scaling(GeometricScaling, chain[TransformationComp_GeometricScaling]);
                aiVector3D GeometricScalingInverse = GeometricScaling;
                bool canscale = true;
                for (unsigned int i = 0; i < 3; ++i) {
                    if (std::fabs(GeometricScalingInverse[i]) > zero_epsilon) {
                        GeometricScalingInverse[i] = 1.0f / GeometricScaling[i];
                    }
                    else {
                        FBXImporter::LogError("cannot invert geometric scaling matrix with a 0.0 scale component");
                        canscale = false;
                        break;
                    }
                }
                if (canscale) {
                    chainBits = chainBits | (1 << TransformationComp_GeometricScalingInverse);
                    aiMatrix4x4::Scaling(GeometricScalingInverse, chain[TransformationComp_GeometricScalingInverse]);
                }
            }

            const aiVector3D& GeometricRotation = PropertyGet<aiVector3D>(props, "GeometricRotation", ok);
            if (ok && GeometricRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricRotation) | (1 << TransformationComp_GeometricRotationInverse);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotation]);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotationInverse]);
                chain[TransformationComp_GeometricRotationInverse].Inverse();
            }

            const aiVector3D& GeometricTranslation = PropertyGet<aiVector3D>(props, "GeometricTranslation", ok);
            if (ok && GeometricTranslation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricTranslation) | (1 << TransformationComp_GeometricTranslationInverse);
                aiMatrix4x4::Translation(GeometricTranslation, chain[TransformationComp_GeometricTranslation]);
                aiMatrix4x4::Translation(-GeometricTranslation, chain[TransformationComp_GeometricTranslationInverse]);
            }

            // is_complex needs to be consistent with NeedsComplexTransformationChain()
            // or the interplay between this code and the animation converter would
            // not be guaranteed.
            ai_assert(NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0));

            // now, if we have more than just Translation, Scaling and Rotation,
            // we need to generate a full node chain to accommodate for assimp's
            // lack to express pivots and offsets.
            if ((chainBits & chainMaskComplex) && doc.Settings().preservePivots) {
                FBXImporter::LogInfo("generating full transformation chain for node: " + name);

                // query the anim_chain_bits dictionary to find out which chain elements
                // have associated node animation channels. These can not be dropped
                // even if they have identity transform in bind pose.
                NodeAnimBitMap::const_iterator it = node_anim_chain_bits.find(name);
                const unsigned int anim_chain_bitmask = (it == node_anim_chain_bits.end() ? 0 : (*it).second);

                unsigned int bit = 0x1;
                for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                    const TransformationComp comp = static_cast<TransformationComp>(i);

                    if ((chainBits & bit) == 0 && (anim_chain_bitmask & bit) == 0) {
                        continue;
                    }

                    if (comp == TransformationComp_PostRotation) {
                        chain[i] = chain[i].Inverse();
                    }

                    aiNode* nd = new aiNode();
                    nd->mName.Set(NameTransformationChainNode(name, comp));
                    nd->mTransformation = chain[i];

                    // geometric inverses go in a post-node chain
                    if (comp == TransformationComp_GeometricScalingInverse ||
                        comp == TransformationComp_GeometricRotationInverse ||
                        comp == TransformationComp_GeometricTranslationInverse
                        ) {
                        post_output_nodes.push_back(nd);
                    }
                    else {
                        output_nodes.push_back(nd);
                    }
                }

                ai_assert(output_nodes.size());
                return true;
            }

            // else, we can just multiply the matrices together
            aiNode* nd = new aiNode();
            output_nodes.push_back(nd);

            // name passed to the method is already unique
            nd->mName.Set(name);

            for (const auto &transform : chain) {
                nd->mTransformation = nd->mTransformation * transform;
            }
            return false;
        }